

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1593.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long in_RAX;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long unmet;
  long local_28;
  
  local_28 = in_RAX;
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                  ,0x24,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                  ,0x26);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar7 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar4,0x21,1);
      uVar7 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar4,0x22,0x5d5a7a78);
        uVar7 = _stderr;
        if (iVar1 == 0) {
          lVar5 = curl_slist_append(0,"If-Modified-Since:");
          if (lVar5 == 0) {
            lVar5 = 0;
            iVar1 = 0x7e;
          }
          else {
            iVar1 = curl_easy_setopt(lVar4,0x2727,lVar5);
            uVar7 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_perform(lVar4);
              if (iVar1 == 0) {
                iVar2 = curl_easy_getinfo(lVar4,0x200023,&local_28);
                iVar1 = 0x77;
                if (local_28 == 1) {
                  iVar1 = iVar2;
                }
                if (iVar2 != 0) {
                  iVar1 = iVar2;
                }
              }
            }
            else {
              uVar3 = curl_easy_strerror(iVar1);
              curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                            ,0x33,iVar1,uVar3);
            }
          }
          goto LAB_001013ab;
        }
        uVar3 = curl_easy_strerror(iVar1);
        uVar6 = 0x2b;
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        uVar6 = 0x29;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      uVar6 = 0x28;
    }
    curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                  ,uVar6,iVar1,uVar3);
    lVar5 = 0;
  }
LAB_001013ab:
  curl_easy_cleanup(lVar4);
  curl_slist_free_all(lVar5);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  struct curl_slist *header = NULL;
  long unmet;
  CURL *curl = NULL;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_TIMECONDITION, (long)CURL_TIMECOND_IFMODSINCE);
  /* Some TIMEVALUE; it doesn't matter. */
  easy_setopt(curl, CURLOPT_TIMEVALUE, 1566210680L);

  header = curl_slist_append(NULL, "If-Modified-Since:");
  if(!header) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_HTTPHEADER, header);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* Confirm that the condition checking still worked, even though we
   * suppressed the actual header.
   * The server returns 304, which means the condition is "unmet".
   */

  res = curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &unmet);
  if(res)
    goto test_cleanup;

  if(unmet != 1L) {
    res = TEST_ERR_FAILURE;
    goto test_cleanup;
  }

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_slist_free_all(header);
  curl_global_cleanup();

  return res;
}